

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O3

hours __thiscall absl::lts_20240722::ToChronoHours(lts_20240722 *this,Duration d)

{
  hours hVar1;
  
  if (d.rep_hi_.lo_ != 0xffffffff) {
    return (hours)((long)(this + (d.rep_hi_.lo_ != 0 && (long)this < 0)) / 0xe10);
  }
  hVar1.__r = -0x8000000000000000;
  if (-1 < (long)this) {
    hVar1.__r = 0x7fffffffffffffff;
  }
  return (hours)hVar1.__r;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool IsInfiniteDuration(Duration d) {
  return GetRepLo(d) == ~uint32_t{0};
}